

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::handlePlusArg
          (CommandLine *this,string_view arg,ParseOptions options,bool *hadUnknowns)

{
  string_view value_00;
  string_view value_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer ppVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_RDX;
  Option *in_RSI;
  long in_RDI;
  undefined1 *in_R8;
  string result_1;
  string_view curr;
  string result;
  element_type *option;
  iterator it;
  size_t idx;
  string_view value;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc40;
  size_type in_stack_fffffffffffffc48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc50;
  undefined1 *puVar4;
  allocator<char> *in_stack_fffffffffffffc60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc68;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  size_t local_2d8;
  char *local_2d0;
  size_t local_2c8;
  undefined8 in_stack_fffffffffffffd40;
  Option *in_stack_fffffffffffffd48;
  size_t in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string_view in_stack_fffffffffffffd60;
  undefined1 local_278 [32];
  element_type *local_258;
  char *local_250;
  undefined8 local_248;
  undefined1 local_240 [32];
  _Self local_220 [3];
  allocator<char> local_201 [33];
  _Self local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  size_type local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  undefined1 *local_1a0;
  Option *local_188;
  char *local_180;
  undefined1 local_178 [8];
  format_args in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffea0;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined8 local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  char *local_d8;
  undefined8 uStack_d0;
  Option **local_c0;
  long local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  undefined8 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  Option **local_58;
  long local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1a0 = in_R8;
  local_188 = in_RSI;
  local_180 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0);
  local_1b8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffc30,(char)((uint)in_stack_fffffffffffffc2c >> 0x18),
                         0x2fab4f);
  if (local_1b8 != 0xffffffffffffffff) {
    local_1c8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           (size_type)in_stack_fffffffffffffc40);
    local_1b0._M_len = local_1c8._M_len;
    local_1b0._M_str = local_1c8._M_str;
    local_1d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           (size_type)in_stack_fffffffffffffc40);
    local_188 = (Option *)local_1d8._M_len;
    local_180 = local_1d8._M_str;
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (pbVar2,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  local_1e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),(key_type *)0x2fac4d)
  ;
  std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  std::allocator<char>::~allocator(local_201);
  local_220[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  bVar1 = std::operator==(&local_1e0,local_220);
  if (bVar1) {
    *local_1a0 = 1;
    local_250 = "{}: unknown command line argument \'{}\'";
    local_248 = 0x26;
    local_50 = in_RDI + 0xb8;
    local_38 = local_240;
    local_48 = "{}: unknown command line argument \'{}\'";
    uStack_40 = 0x26;
    local_58 = &local_188;
    local_68 = "{}: unknown command line argument \'{}\'";
    uStack_60 = 0x26;
    puVar4 = local_98;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffc40,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc38);
    local_28 = &local_78;
    local_78 = 0xdd;
    local_30 = puVar4;
    local_70 = puVar4;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(in_stack_fffffffffffffc30);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
                           *)0x2fae7c);
    local_258 = std::__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>::get
                          (&(ppVar3->second).
                            super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>
                          );
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1b0);
    if (bVar1) {
      bVar1 = Option::expectsValue((Option *)0x2faeb3);
      if (bVar1) {
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RDI + 0xd8);
        local_b8 = in_RDI + 0xb8;
        local_a0 = local_278;
        local_b0 = "{}: no value provided for argument \'{}\'";
        uStack_a8 = 0x27;
        local_c0 = &local_188;
        local_d8 = "{}: no value provided for argument \'{}\'";
        uStack_d0 = 0x27;
        pbVar2 = &local_108;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)this_00,pbVar2);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)this_00,
                   (basic_string_view<char,_std::char_traits<char>_> *)pbVar2);
        local_18 = &local_e8;
        local_e8 = 0xdd;
        local_20 = pbVar2;
        local_e0 = pbVar2;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this_00,pbVar2);
        std::__cxx11::string::~string(in_stack_fffffffffffffc30);
      }
      else {
        local_2c8 = local_1b0._M_len;
        value_00._M_str = in_stack_fffffffffffffd58;
        value_00._M_len = (size_t)local_180;
        Option::set_abi_cxx11_
                  (local_188,in_stack_fffffffffffffd60,value_00,
                   SUB81((ulong)local_1b0._M_str >> 0x38,0));
        std::__cxx11::string::~string(in_stack_fffffffffffffc30);
      }
    }
    else {
      do {
        local_2d8 = local_1b0._M_len;
        local_2d0 = local_1b0._M_str;
        local_1b8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffc30,
                               (char)((uint)in_stack_fffffffffffffc2c >> 0x18),0x2fb0fa);
        if (local_1b8 == 0xffffffffffffffff) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_308);
          local_1b0._M_len = local_308._M_len;
          local_1b0._M_str = local_308._M_str;
        }
        else {
          local_2e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                                 (size_type)in_stack_fffffffffffffc40);
          local_1b0._M_len = local_2e8._M_len;
          local_1b0._M_str = local_2e8._M_str;
          local_2f8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                                 (size_type)in_stack_fffffffffffffc40);
          local_2d8 = local_2f8._M_len;
          local_2d0 = local_2f8._M_str;
        }
        value_01._M_str = in_stack_fffffffffffffd58;
        value_01._M_len = in_stack_fffffffffffffd50;
        Option::set_abi_cxx11_
                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd60,value_01,
                   SUB81((ulong)in_stack_fffffffffffffd40 >> 0x38,0));
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2fb26a)
        ;
        if (!bVar1) {
          in_stack_fffffffffffffc30 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38
                    );
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38
                    );
          local_8 = &stack0xfffffffffffffea8;
          local_10 = local_178;
          uVar5 = 0xdd;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffea0,in_stack_fffffffffffffe90);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
          std::__cxx11::string::~string(in_stack_fffffffffffffc30);
        }
        std::__cxx11::string::~string(in_stack_fffffffffffffc30);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1b0);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  return;
}

Assistant:

void CommandLine::handlePlusArg(std::string_view arg, ParseOptions options, bool& hadUnknowns) {
    // Values are plus separated.
    std::string_view value;
    size_t idx = arg.find_first_of('+', 2);
    if (idx != std::string_view::npos) {
        value = arg.substr(idx + 1);
        arg = arg.substr(0, idx);
    }

    auto it = optionMap.find(std::string(arg));
    if (it == optionMap.end()) {
        hadUnknowns = true;
        errors.emplace_back(
            fmt::format("{}: unknown command line argument '{}'"sv, programName, arg));
        return;
    }

    auto option = it->second.get();
    if (value.empty()) {
        if (option->expectsValue()) {
            errors.emplace_back(
                fmt::format("{}: no value provided for argument '{}'"sv, programName, arg));
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            SLANG_ASSERT(result.empty());
        }
        return;
    }

    do {
        std::string_view curr = value;
        idx = value.find_first_of('+');
        if (idx != std::string_view::npos) {
            value = value.substr(idx + 1);
            curr = curr.substr(0, idx);
        }
        else {
            value = {};
        }

        std::string result = option->set(arg, curr, options.ignoreDuplicates);
        if (!result.empty())
            errors.emplace_back(fmt::format("{}: {}", programName, result));

    } while (!value.empty());
}